

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::write_escaped_cp<fmt::v10::appender,char>
                   (appender out,find_escape_result<char> *escape)

{
  uint cp;
  char *pcVar1;
  appender aVar2;
  type tVar3;
  type tVar4;
  char c;
  char local_2c [4];
  
  cp = escape->cp;
  c = (char)cp;
  if (cp == 9) {
    local_2c[1] = 0x5c;
    buffer<char>::push_back
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
               local_2c + 1);
    c = 't';
    goto LAB_00233944;
  }
  if (cp != 0x5c) {
    if (cp == 0xd) {
      local_2c[2] = 0x5c;
      buffer<char>::push_back
                ((buffer<char> *)
                 out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                 local_2c + 2);
      c = 'r';
      goto LAB_00233944;
    }
    if ((cp != 0x22) && (cp != 0x27)) {
      if (cp != 10) {
        if (cp < 0x100) {
          aVar2 = write_codepoint<2ul,char,fmt::v10::appender>(out,'x',cp);
          return (appender)
                 aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        }
        if (0xffff < cp) {
          if (0x10ffff < cp) {
            pcVar1 = escape->begin;
            tVar3 = to_unsigned<long>((long)escape->end - (long)pcVar1);
            for (tVar4 = 0; tVar3 != tVar4; tVar4 = tVar4 + 1) {
              out = write_codepoint<2ul,char,fmt::v10::appender>(out,'x',(uint)(byte)pcVar1[tVar4]);
            }
            return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
                   out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
          }
          aVar2 = write_codepoint<8ul,char,fmt::v10::appender>(out,'U',cp);
          return (appender)
                 aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
        }
        aVar2 = write_codepoint<4ul,char,fmt::v10::appender>(out,'u',cp);
        return (appender)aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
        ;
      }
      local_2c[3] = 0x5c;
      buffer<char>::push_back
                ((buffer<char> *)
                 out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                 local_2c + 3);
      c = 'n';
      goto LAB_00233944;
    }
  }
  local_2c[0] = '\\';
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,local_2c);
LAB_00233944:
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,&c);
  return (appender)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (escape.cp < 0x100) {
      return write_codepoint<2, Char>(out, 'x', escape.cp);
    }
    if (escape.cp < 0x10000) {
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    }
    if (escape.cp < 0x110000) {
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}